

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::AssertionHandler::handleUnexpectedInflightException(AssertionHandler *this)

{
  long *plVar1;
  long in_RDI;
  string local_28 [40];
  
  plVar1 = *(long **)(in_RDI + 0x40);
  translateActiveException_abi_cxx11_();
  (**(code **)(*plVar1 + 0x68))(plVar1,in_RDI,local_28,in_RDI + 0x38);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void AssertionHandler::handleUnexpectedInflightException() {
        m_resultCapture.handleUnexpectedInflightException( m_assertionInfo, Catch::translateActiveException(), m_reaction );
    }